

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Subscription * UA_Subscription_new(UA_Session *session,UA_UInt32 subscriptionID)

{
  UA_Subscription *new;
  UA_UInt32 subscriptionID_local;
  UA_Session *session_local;
  
  session_local = (UA_Session *)malloc(0x80);
  if (session_local == (UA_Session *)0x0) {
    session_local = (UA_Session *)0x0;
  }
  else {
    (session_local->clientDescription).productUri.length = (size_t)session;
    *(UA_UInt32 *)&(session_local->clientDescription).applicationName.locale.data = subscriptionID;
    *(undefined4 *)((long)&(session_local->clientDescription).applicationName.text.data + 4) = 0;
    *(undefined4 *)((long)&(session_local->clientDescription).productUri.data + 4) = 0;
    *(undefined1 *)&(session_local->clientDescription).applicationName.text.length = 0;
    memset((void *)((long)&(session_local->clientDescription).gatewayServerUri.length + 4),0,0x10);
    *(undefined1 *)((long)&(session_local->clientDescription).discoveryProfileUri.length + 4) = 0;
    (session_local->clientDescription).applicationType = UA_APPLICATIONTYPE_SERVER;
    *(undefined4 *)&(session_local->clientDescription).field_0x44 = 0;
    *(undefined4 *)&(session_local->clientDescription).gatewayServerUri.length = 0;
    *(undefined4 *)&(session_local->clientDescription).applicationName.text.data = 0;
    (session_local->clientDescription).discoveryProfileUri.data = (UA_Byte *)0x0;
    (session_local->clientDescription).discoveryUrlsSize = 0;
    (session_local->clientDescription).discoveryUrls =
         (UA_String *)&(session_local->clientDescription).discoveryUrlsSize;
    *(undefined4 *)&session_local->activated = 0;
  }
  return (UA_Subscription *)session_local;
}

Assistant:

UA_Subscription * UA_Subscription_new(UA_Session *session, UA_UInt32 subscriptionID) {
    UA_Subscription *new = UA_malloc(sizeof(UA_Subscription));
    if(!new)
        return NULL;
    new->session = session;
    new->subscriptionID = subscriptionID;
    new->sequenceNumber = 0;
    new->maxKeepAliveCount = 0;
    new->publishingEnabled = false;
    memset(&new->publishJobGuid, 0, sizeof(UA_Guid));
    new->publishJobIsRegistered = false;
    new->currentKeepAliveCount = 0;
    new->currentLifetimeCount = 0;
    new->lastMonitoredItemId = 0;
    new->state = UA_SUBSCRIPTIONSTATE_NORMAL; /* The first publish response is sent immediately */
    LIST_INIT(&new->monitoredItems);
    TAILQ_INIT(&new->retransmissionQueue);
    new->retransmissionQueueSize = 0;
    return new;
}